

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

secp256k1_bulletproof_generators *
secp256k1_bulletproof_generators_create
          (secp256k1_context *ctx,secp256k1_generator *blinding_gen,size_t n)

{
  int iVar1;
  secp256k1_bulletproof_generators *__ptr;
  secp256k1_ge *psVar2;
  size_t extraout_RDX;
  size_t outlen;
  size_t extraout_RDX_00;
  secp256k1_fe *r;
  secp256k1_ge *r_00;
  uchar tmp [32];
  uchar seed [64];
  secp256k1_generator gen;
  secp256k1_rfc6979_hmac_sha256 rng;
  uchar local_118 [64];
  uchar local_d8 [36];
  secp256k1_generator local_b4;
  secp256k1_rfc6979_hmac_sha256 local_74;
  
  if (blinding_gen == (secp256k1_generator *)0x0) {
LAB_0010f8de:
    secp256k1_bulletproof_generators_create_cold_2();
  }
  else {
    __ptr = (secp256k1_bulletproof_generators *)malloc(0x18);
    if (__ptr == (secp256k1_bulletproof_generators *)0x0) {
      (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
    }
    else {
      psVar2 = (secp256k1_ge *)malloc(n * 0x58 + 0x58);
      if (psVar2 != (secp256k1_ge *)0x0) {
        __ptr->gens = psVar2;
        r_00 = psVar2 + n;
        __ptr->blinding_gen = r_00;
        __ptr->n = n;
        secp256k1_fe_get_b32(local_118 + 0x20,&secp256k1_ge_const_g.x);
        secp256k1_fe_get_b32(local_d8,&secp256k1_ge_const_g.y);
        secp256k1_rfc6979_hmac_sha256_initialize(&local_74,local_118 + 0x20,0x40);
        if (n != 0) {
          r = &psVar2->y;
          outlen = extraout_RDX;
          do {
            local_118[0x10] = '\0';
            local_118[0x11] = '\0';
            local_118[0x12] = '\0';
            local_118[0x13] = '\0';
            local_118[0x14] = '\0';
            local_118[0x15] = '\0';
            local_118[0x16] = '\0';
            local_118[0x17] = '\0';
            local_118[0x18] = '\0';
            local_118[0x19] = '\0';
            local_118[0x1a] = '\0';
            local_118[0x1b] = '\0';
            local_118[0x1c] = '\0';
            local_118[0x1d] = '\0';
            local_118[0x1e] = '\0';
            local_118[0x1f] = '\0';
            local_118[0] = '\0';
            local_118[1] = '\0';
            local_118[2] = '\0';
            local_118[3] = '\0';
            local_118[4] = '\0';
            local_118[5] = '\0';
            local_118[6] = '\0';
            local_118[7] = '\0';
            local_118[8] = '\0';
            local_118[9] = '\0';
            local_118[10] = '\0';
            local_118[0xb] = '\0';
            local_118[0xc] = '\0';
            local_118[0xd] = '\0';
            local_118[0xe] = '\0';
            local_118[0xf] = '\0';
            secp256k1_rfc6979_hmac_sha256_generate(&local_74,local_118,outlen);
            iVar1 = secp256k1_generator_generate_internal(ctx,&local_b4,local_118,(uchar *)0x0);
            if (iVar1 == 0) {
              secp256k1_bulletproof_generators_create_cold_1();
              goto LAB_0010f8de;
            }
            secp256k1_fe_set_b32((secp256k1_fe *)(r + -1),local_b4.data);
            secp256k1_fe_set_b32(r,local_b4.data + 0x20);
            *(int *)(r + 1) = 0;
            r = (secp256k1_fe *)((long)(r + 2) + 8);
            n = n - 1;
            outlen = extraout_RDX_00;
          } while (n != 0);
        }
        secp256k1_fe_set_b32(&r_00->x,blinding_gen->data);
        secp256k1_fe_set_b32(&r_00->y,blinding_gen->data + 0x20);
        r_00->infinity = 0;
        return __ptr;
      }
      (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
      __ptr->gens = (secp256k1_ge *)0x0;
      free(__ptr);
    }
  }
  return (secp256k1_bulletproof_generators *)0x0;
}

Assistant:

secp256k1_bulletproof_generators *secp256k1_bulletproof_generators_create(const secp256k1_context *ctx, const secp256k1_generator *blinding_gen, size_t n) {
    secp256k1_bulletproof_generators *ret;
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char seed[64];
    secp256k1_gej precompj;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(blinding_gen != NULL);

    ret = (secp256k1_bulletproof_generators *)checked_malloc(&ctx->error_callback, sizeof(*ret));
    if (ret == NULL) {
        return NULL;
    }
    ret->gens = (secp256k1_ge *)checked_malloc(&ctx->error_callback, (n + 1) * sizeof(*ret->gens));
    if (ret->gens == NULL) {
        free(ret);
        return NULL;
    }
    ret->blinding_gen = &ret->gens[n];
    ret->n = n;

    secp256k1_fe_get_b32(&seed[0], &secp256k1_ge_const_g.x);
    secp256k1_fe_get_b32(&seed[32], &secp256k1_ge_const_g.y);

    secp256k1_rfc6979_hmac_sha256_initialize(&rng, seed, 64);
    for (i = 0; i < n; i++) {
        unsigned char tmp[32] = { 0 };
        secp256k1_generator gen;
        secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
        CHECK(secp256k1_generator_generate(ctx, &gen, tmp));
        secp256k1_generator_load(&ret->gens[i], &gen);

        secp256k1_gej_set_ge(&precompj, &ret->gens[i]);
    }

    secp256k1_generator_load(&ret->blinding_gen[0], blinding_gen);
    secp256k1_gej_set_ge(&precompj, &ret->blinding_gen[0]);

    return ret;
}